

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

LocalScopeInfoIdToScopeInfoMap * __thiscall
Js::ByteCodeCache::EnsureLocalScopeInfoIdToScopeInfoMap
          (ByteCodeCache *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  ArenaAllocator *allocator;
  undefined4 *puVar4;
  TrackAllocData local_40;
  ScriptContext *local_18;
  ScriptContext *scriptContext_local;
  ByteCodeCache *this_local;
  
  local_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  if (this->localScopeInfoIdToScopeInfoMap == (LocalScopeInfoIdToScopeInfoMap *)0x0) {
    pAVar3 = &ScriptContext::SourceCodeAllocator(scriptContext)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,
               (type_info *)
               &JsUtil::
                BaseDictionary<unsigned_int,Js::ScopeInfo*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0x133b);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_40);
    this_00 = (BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar3,0x3f67b0);
    allocator = ScriptContext::SourceCodeAllocator(local_18);
    JsUtil::
    BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,allocator,10);
    this->localScopeInfoIdToScopeInfoMap = this_00;
  }
  if (this->localScopeInfoIdToScopeInfoMap == (LocalScopeInfoIdToScopeInfoMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x133d,"(this->localScopeInfoIdToScopeInfoMap != nullptr)",
                                "this->localScopeInfoIdToScopeInfoMap != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return this->localScopeInfoIdToScopeInfoMap;
}

Assistant:

ByteCodeCache::LocalScopeInfoIdToScopeInfoMap * ByteCodeCache::EnsureLocalScopeInfoIdToScopeInfoMap(ScriptContext * scriptContext)
{
    if (this->localScopeInfoIdToScopeInfoMap == nullptr)
    {
        this->localScopeInfoIdToScopeInfoMap = Anew(scriptContext->SourceCodeAllocator(), LocalScopeInfoIdToScopeInfoMap, scriptContext->SourceCodeAllocator(), 10);
    }
    Assert(this->localScopeInfoIdToScopeInfoMap != nullptr);
    return this->localScopeInfoIdToScopeInfoMap;
}